

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

int trie_prefixes(trie t,trie_key key,vector prefixes)

{
  trie_node ptVar1;
  trie_node ptVar2;
  size_t sVar3;
  
  if ((prefixes != (vector)0x0 && (key != (trie_key)0x0 && t != (trie)0x0)) &&
     (ptVar2 = trie_node_find(t,key), ptVar2 != (trie_node)0x0)) {
    for (sVar3 = ptVar2->self_index; sVar3 != 0; sVar3 = ptVar1[sVar3].parent_index) {
      ptVar1 = t->node_list;
      vector_push_front(prefixes,&ptVar1[sVar3].key);
    }
    if (ptVar2 != (trie_node)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int trie_prefixes(trie t, trie_key key, vector prefixes)
{
	if (t != NULL && key != NULL && prefixes != NULL)
	{
		trie_node node_iterator = trie_node_find(t, key);

		if (node_iterator != NULL)
		{
			size_t index_iterator;

			for (index_iterator = node_iterator->self_index; index_iterator > 0; index_iterator = node_iterator->parent_index)
			{
				node_iterator = &t->node_list[index_iterator];

				vector_push_front(prefixes, &node_iterator->key);
			}

			return 0;
		}
	}

	return 1;
}